

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O0

DeviceMemoryRangeVk * __thiscall
Diligent::DeviceMemoryVkImpl::GetRange
          (DeviceMemoryRangeVk *__return_storage_ptr__,DeviceMemoryVkImpl *this,Uint64 Offset,
          Uint64 Size)

{
  ulong uVar1;
  size_type sVar2;
  Char *pCVar3;
  const_reference this_00;
  VkDeviceMemory_T *pVVar4;
  unsigned_long *puVar5;
  unsigned_long local_88;
  undefined1 local_80 [8];
  string msg_1;
  Uint64 OffsetInPage;
  undefined1 local_48 [8];
  string msg;
  size_t PageIdx;
  Uint64 Size_local;
  Uint64 Offset_local;
  DeviceMemoryVkImpl *this_local;
  
  uVar1 = Offset / (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                   .m_Desc.PageSize;
  __return_storage_ptr__->Handle = (VkDeviceMemory)0x0;
  __return_storage_ptr__->Offset = 0;
  __return_storage_ptr__->Size = 0;
  msg.field_2._8_8_ = uVar1;
  PageIdx = Size;
  Size_local = Offset;
  Offset_local = (Uint64)this;
  sVar2 = std::
          vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
          ::size(&this->m_Pages);
  if (uVar1 < sVar2) {
    msg_1.field_2._8_8_ =
         Size_local %
         (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
         .m_Desc.PageSize;
    if ((this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
        .m_Desc.PageSize < msg_1.field_2._8_8_ + PageIdx) {
      FormatString<char[77]>
                ((string *)local_80,
                 (char (*) [77])
                 "DeviceMemoryVkImpl::GetRange(): Offset and Size must be inside a single page");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"GetRange",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
                 ,0xc1);
      std::__cxx11::string::~string((string *)local_80);
    }
    else {
      __return_storage_ptr__->Offset = msg_1.field_2._8_8_;
      this_00 = std::
                vector<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>_>_>
                ::operator[](&this->m_Pages,msg.field_2._8_8_);
      pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDeviceMemory_T_
                         ((VulkanObjectWrapper *)this_00);
      __return_storage_ptr__->Handle = pVVar4;
      local_88 = (this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                 .m_Desc.PageSize - msg_1.field_2._8_8_;
      puVar5 = std::min<unsigned_long>(&local_88,&PageIdx);
      __return_storage_ptr__->Size = *puVar5;
    }
  }
  else {
    FormatString<char[72]>
              ((string *)local_48,
               (char (*) [72])
               "DeviceMemoryVkImpl::GetRange(): Offset is out of allocated space bounds");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"GetRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceMemoryVkImpl.cpp"
               ,0xba);
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

DeviceMemoryRangeVk DeviceMemoryVkImpl::GetRange(Uint64 Offset, Uint64 Size) const
{
    const auto PageIdx = static_cast<size_t>(Offset / m_Desc.PageSize);

    DeviceMemoryRangeVk Range{};
    if (PageIdx >= m_Pages.size())
    {
        DEV_ERROR("DeviceMemoryVkImpl::GetRange(): Offset is out of allocated space bounds");
        return Range;
    }

    const auto OffsetInPage = Offset % m_Desc.PageSize;
    if (OffsetInPage + Size > m_Desc.PageSize)
    {
        DEV_ERROR("DeviceMemoryVkImpl::GetRange(): Offset and Size must be inside a single page");
        return Range;
    }

    Range.Offset = OffsetInPage;
    Range.Handle = m_Pages[PageIdx];
    Range.Size   = std::min(m_Desc.PageSize - OffsetInPage, Size);

    return Range;
}